

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::NetState::InternalSerializeWithCachedSizesToArray
          (NetState *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint uVar1;
  int iVar2;
  char *data;
  void *pvVar3;
  bool bVar4;
  Type *pTVar5;
  uint8 *puVar6;
  byte *pbVar7;
  ulong uVar8;
  int index;
  ulong uVar9;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    uVar8 = (ulong)this->phase_;
    pbVar7 = target + 1;
    *target = '\b';
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar7 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar4);
    }
    *pbVar7 = (byte)uVar9;
    target = pbVar7 + 1;
  }
  if ((uVar1 & 1) != 0) {
    uVar8 = (ulong)this->level_;
    pbVar7 = target + 1;
    *target = 0x10;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar7 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar4);
    }
    *pbVar7 = (byte)uVar9;
    target = pbVar7 + 1;
  }
  iVar2 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    this_00 = &this->stage_;
    index = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      data = (pTVar5->_M_dataplus)._M_p;
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar5->_M_string_length,SERIALIZE,"caffe.NetState.stage");
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      *target = 0x1a;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar5,target + 1);
      index = index + 1;
    } while (iVar2 != index);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar6 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar6;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* NetState::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.NetState)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.Phase phase = 1 [default = TEST];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->phase(), target);
  }

  // optional int32 level = 2 [default = 0];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->level(), target);
  }

  // repeated string stage = 3;
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->stage(i).data(), this->stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetState.stage");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->stage(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.NetState)
  return target;
}